

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_compress.hpp
# Opt level: O3

void __thiscall
duckdb::AlpRDCompressionState<float>::FlushSegment(AlpRDCompressionState<float> *this)

{
  BlockManager *pBVar1;
  uint *puVar2;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> _Var3;
  uint uVar4;
  idx_t iVar5;
  idx_t iVar6;
  size_t __n;
  ulong val;
  ulong uVar7;
  ulong uVar8;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_60;
  BufferHandle *local_58;
  ColumnCheckpointState *local_50;
  BufferHandle local_48;
  
  local_50 = ColumnDataCheckpointData::GetCheckpointState(this->checkpoint_data);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  pBVar1 = (this->super_CompressionState).info.block_manager;
  puVar2 = (uint *)((this->handle).node.ptr)->buffer;
  uVar7 = this->data_bytes_used + (ulong)(this->actual_dictionary_size_bytes + 7) + 7 &
          0xfffffffffffffff8;
  iVar5 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar6 = optional_idx::GetIndex(&pBVar1->block_header_size);
  __n = (long)puVar2 + ((iVar5 - iVar6) - (long)this->metadata_ptr);
  pBVar1 = (this->super_CompressionState).info.block_manager;
  iVar5 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar6 = optional_idx::GetIndex(&pBVar1->block_header_size);
  uVar8 = __n + uVar7;
  local_58 = &this->handle;
  val = iVar5 - iVar6;
  if ((float)uVar8 / (float)(iVar5 - iVar6) < 0.8) {
    memmove((void *)(uVar7 + (long)puVar2),this->metadata_ptr,__n);
    val = uVar8;
  }
  uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(val);
  *puVar2 = uVar4;
  *(uint8_t *)(puVar2 + 1) = (this->state).right_bit_width;
  *(uint8_t *)((long)puVar2 + 5) = (this->state).left_bit_width;
  *(uint8_t *)((long)puVar2 + 6) = (this->state).actual_dictionary_size;
  switchD_012bc561::default
            ((void *)((long)puVar2 + 7),(this->state).left_parts_dict,
             (ulong)this->actual_dictionary_size_bytes);
  local_60._M_head_impl =
       (this->current_segment).
       super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
       super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
  (this->current_segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  BufferHandle::BufferHandle(&local_48,local_58);
  (*local_50->_vptr_ColumnCheckpointState[4])(local_50,&local_60,&local_48,val);
  BufferHandle::~BufferHandle(&local_48);
  _Var3._M_head_impl = local_60._M_head_impl;
  if (local_60._M_head_impl != (ColumnSegment *)0x0) {
    ColumnSegment::~ColumnSegment(local_60._M_head_impl);
    operator_delete(_Var3._M_head_impl);
  }
  this->vectors_flushed = 0;
  this->data_bytes_used = 0;
  return;
}

Assistant:

void FlushSegment() {
		auto &checkpoint_state = checkpoint_data.GetCheckpointState();
		auto dataptr = handle.Ptr();

		idx_t metadata_offset = AlignValue(UsedSpace());

		// Verify that the metadata_ptr is not smaller than the space used by the data
		D_ASSERT(dataptr + metadata_offset <= metadata_ptr);

		auto bytes_used_by_metadata = UnsafeNumericCast<idx_t>(dataptr + info.GetBlockSize() - metadata_ptr);

		// Initially the total segment size is the size of the block
		auto total_segment_size = info.GetBlockSize();

		//! We compact the block if the space used is less than a threshold
		const auto used_space_percentage =
		    static_cast<float>(metadata_offset + bytes_used_by_metadata) / static_cast<float>(total_segment_size);
		if (used_space_percentage < AlpConstants::COMPACT_BLOCK_THRESHOLD) {
#ifdef DEBUG
			//! Copy the first 4 bytes of the metadata
			uint32_t verify_bytes;
			memcpy((void *)&verify_bytes, metadata_ptr, 4);
#endif
			memmove(dataptr + metadata_offset, metadata_ptr, bytes_used_by_metadata);
#ifdef DEBUG
			//! Now assert that the memmove was correct
			D_ASSERT(verify_bytes == *(uint32_t *)(dataptr + metadata_offset));
#endif
			total_segment_size = metadata_offset + bytes_used_by_metadata;
		}

		// Store the offset to the end of metadata (to be used as a backwards pointer in decoding)
		Store<uint32_t>(NumericCast<uint32_t>(total_segment_size), dataptr);
		dataptr += AlpRDConstants::METADATA_POINTER_SIZE;

		// Store the right bw for the segment
		Store<uint8_t>(state.right_bit_width, dataptr);
		dataptr += AlpRDConstants::RIGHT_BIT_WIDTH_SIZE;

		// Store the left bw for the segment
		Store<uint8_t>(state.left_bit_width, dataptr);
		dataptr += AlpRDConstants::LEFT_BIT_WIDTH_SIZE;

		// Store the actual number of elements on the dictionary of the segment
		Store<uint8_t>(state.actual_dictionary_size, dataptr);
		dataptr += AlpRDConstants::N_DICTIONARY_ELEMENTS_SIZE;

		// Store the Dictionary
		memcpy((void *)dataptr, (void *)state.left_parts_dict, actual_dictionary_size_bytes);

		checkpoint_state.FlushSegment(std::move(current_segment), std::move(handle), total_segment_size);
		data_bytes_used = 0;
		vectors_flushed = 0;
	}